

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_v1_generated.h
# Opt level: O1

bool __thiscall Evolution::V1::TableA::Verify(TableA *this,Verifier *verifier)

{
  bool bVar1;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if (((bVar1) &&
      (bVar1 = flatbuffers::Table::VerifyField<float>(&this->super_Table,verifier,4,4), bVar1)) &&
     (bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4), bVar1)) {
    verifier->depth_ = verifier->depth_ - 1;
    return true;
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<float>(verifier, VT_A, 4) &&
           VerifyField<int32_t>(verifier, VT_B, 4) &&
           verifier.EndTable();
  }